

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_any_join.cpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalAnyJoin *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  reference pvVar1;
  type pLVar2;
  PhysicalOperator *pPVar3;
  PhysicalOperator *args_2;
  
  this_00 = &(op->super_LogicalJoin).super_LogicalOperator.children;
  pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,0);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar1);
  pPVar3 = CreatePlan(this,pLVar2);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(this_00,1);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar1);
  args_2 = CreatePlan(this,pLVar2);
  pPVar3 = Make<duckdb::PhysicalBlockwiseNLJoin,duckdb::LogicalAnyJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::JoinType&,unsigned_long&>
                     (this,op,pPVar3,args_2,&op->condition,
                      &(op->super_LogicalJoin).super_LogicalOperator.field_0x61,
                      &(op->super_LogicalJoin).super_LogicalOperator.estimated_cardinality);
  return pPVar3;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalAnyJoin &op) {
	// Visit the child nodes.
	D_ASSERT(op.children.size() == 2);
	D_ASSERT(op.condition);
	auto &left = CreatePlan(*op.children[0]);
	auto &right = CreatePlan(*op.children[1]);

	// Create the blockwise NL join.
	return Make<PhysicalBlockwiseNLJoin>(op, left, right, std::move(op.condition), op.join_type,
	                                     op.estimated_cardinality);
}